

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O3

CKey __thiscall ADPlanner::ComputeKey(ADPlanner *this,ADState *state)

{
  long in_RDX;
  uint uVar1;
  CKey *key;
  bool bVar2;
  CKey CVar3;
  
  bVar2 = *(uint *)(in_RDX + 0x24) <= *(uint *)(in_RDX + 0x20);
  if (bVar2) {
    uVar1 = *(uint *)(in_RDX + 0x24) +
            (int)((double)*(int *)(in_RDX + 0x44) * **(double **)(state + 0x78));
  }
  else {
    uVar1 = *(uint *)(in_RDX + 0x20) + *(int *)(in_RDX + 0x44);
  }
  (this->super_SBPLPlanner)._vptr_SBPLPlanner = (_func_int **)(ulong)uVar1;
  (this->super_SBPLPlanner).environment_ = (DiscreteSpaceInformation *)(ulong)bVar2;
  CVar3.key[1]._0_1_ = bVar2;
  CVar3.key[0] = (long)this;
  CVar3.key[1]._1_7_ = 0;
  return (CKey)CVar3.key;
}

Assistant:

CKey ADPlanner::ComputeKey(ADState* state)
{
    CKey key;

    if (state->v >= state->g) {
        key.key[0] = state->g + (int)(pSearchStateSpace_->eps * state->h);
        key.key[1] = 1;
    }
    else {
        key.key[0] = state->v + state->h;
        key.key[1] = 0;
    }

    return key;
}